

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# heritage.cc
# Opt level: O1

void __thiscall
Heritage::splitPieces
          (Heritage *this,vector<Varnode_*,_std::allocator<Varnode_*>_> *vnlist,PcodeOp *insertop,
          Address *addr,int4 size,Varnode *startvn)

{
  uint uVar1;
  Varnode *vn;
  Funcdata *this_00;
  bool bVar2;
  Address *pAVar3;
  long lVar4;
  pointer ppVVar5;
  PcodeOp *op;
  uintb uVar6;
  Varnode *vn_00;
  ulong uVar7;
  ulong uVar8;
  iterator local_68;
  BlockBasic *local_60;
  Address local_48;
  Varnode *local_38;
  
  local_48.base = (AddrSpace *)0x0;
  uVar1 = addr->base->flags;
  lVar4 = (long)(int)(-(uVar1 & 1) & size) + addr->offset;
  local_38 = startvn;
  if (insertop == (PcodeOp *)0x0) {
    local_60 = (BlockBasic *)BlockGraph::getStartBlock(&this->fd->bblocks);
    local_68._M_node =
         (local_60->op).super__List_base<PcodeOp_*,_std::allocator<PcodeOp_*>_>._M_impl._M_node.
         super__List_node_base._M_next;
    local_48.base = (this->fd->baseaddr).base;
    pAVar3 = &this->fd->baseaddr;
  }
  else {
    local_48.base = (insertop->start).pc.base;
    local_60 = insertop->parent;
    local_68._M_node = ((insertop->basiciter)._M_node)->_M_next;
    pAVar3 = &(insertop->start).pc;
  }
  local_48.offset = pAVar3->offset;
  ppVVar5 = (vnlist->super__Vector_base<Varnode_*,_std::allocator<Varnode_*>_>)._M_impl.
            super__Vector_impl_data._M_start;
  if ((vnlist->super__Vector_base<Varnode_*,_std::allocator<Varnode_*>_>)._M_impl.
      super__Vector_impl_data._M_finish != ppVVar5) {
    uVar7 = 0;
    uVar8 = 1;
    do {
      vn = ppVVar5[uVar7];
      op = Funcdata::newOp(this->fd,2,&local_48);
      Funcdata::opSetOpcode(this->fd,op,CPUI_SUBPIECE);
      uVar6 = (vn->loc).offset;
      if ((uVar1 & 1) == 0) {
        uVar6 = uVar6 - lVar4;
      }
      else {
        uVar6 = lVar4 - (uVar6 + (long)vn->size);
      }
      Funcdata::opSetInput(this->fd,op,local_38,0);
      this_00 = this->fd;
      vn_00 = Funcdata::newConstant(this_00,4,uVar6);
      Funcdata::opSetInput(this_00,op,vn_00,1);
      Funcdata::opSetOutput(this->fd,op,vn);
      Funcdata::opInsert(this->fd,op,local_60,local_68);
      ppVVar5 = (vnlist->super__Vector_base<Varnode_*,_std::allocator<Varnode_*>_>)._M_impl.
                super__Vector_impl_data._M_start;
      bVar2 = uVar8 < (ulong)((long)(vnlist->
                                    super__Vector_base<Varnode_*,_std::allocator<Varnode_*>_>).
                                    _M_impl.super__Vector_impl_data._M_finish - (long)ppVVar5 >> 3);
      uVar7 = uVar8;
      uVar8 = (ulong)((int)uVar8 + 1);
    } while (bVar2);
  }
  return;
}

Assistant:

void Heritage::splitPieces(const vector<Varnode *> &vnlist,PcodeOp *insertop,
			   const Address &addr,int4 size,Varnode *startvn)

{
  Address opaddress;
  uintb baseoff;
  bool isbigendian;
  BlockBasic *bl;
  list<PcodeOp *>::iterator insertiter;

  isbigendian = addr.isBigEndian();
  if (isbigendian)
    baseoff = addr.getOffset() + size;
  else
    baseoff = addr.getOffset();
  if (insertop == (PcodeOp *)0) {
    bl = (BlockBasic *)fd->getBasicBlocks().getStartBlock();
    insertiter = bl->beginOp();
    opaddress = fd->getAddress();
  }
  else {
    bl = insertop->getParent();
    insertiter = insertop->getBasicIter();
    ++insertiter;		// Insert AFTER the write
    opaddress = insertop->getAddr();
  }

  for(uint4 i=0;i<vnlist.size();++i) {
    Varnode *vn = vnlist[i];
    PcodeOp *newop = fd->newOp(2,opaddress);
    fd->opSetOpcode(newop,CPUI_SUBPIECE);
    uintb diff;
    if (isbigendian)
      diff = baseoff - (vn->getOffset() + vn->getSize());
    else
      diff = vn->getOffset() - baseoff;
    fd->opSetInput(newop,startvn,0);
    fd->opSetInput(newop,fd->newConstant(4,diff),1);
    fd->opSetOutput(newop,vn);
    fd->opInsert(newop,bl,insertiter);
  }
}